

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_memory_mapping.c
# Opt level: O3

void walk_pml4e(MemoryMappingList *list,AddressSpace *as,hwaddr pml4e_start_addr,int32_t a20_mask,
               target_ulong start_line_addr)

{
  _Bool _Var1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong virt_addr;
  
  uVar2 = (ulong)a20_mask;
  lVar5 = 0;
  do {
    uVar3 = address_space_ldq_x86_64
                      ((uc_struct_conflict *)as->uc,as,pml4e_start_addr + lVar5 * 8 & uVar2,
                       (MemTxAttrs)0x1,(MemTxResult *)0x0);
    if ((uVar3 & 1) != 0) {
      uVar7 = 0;
      lVar6 = 0;
      do {
        uVar4 = address_space_ldq_x86_64
                          ((uc_struct_conflict *)as->uc,as,
                           (uVar3 & uVar2 & 0xffffffffff000) + lVar6 & uVar2,(MemTxAttrs)0x1,
                           (MemTxResult *)0x0);
        if ((uVar4 & 1) != 0) {
          virt_addr = lVar5 << 0x27 | start_line_addr | uVar7;
          if ((char)uVar4 < '\0') {
            _Var1 = cpu_physical_memory_is_io_x86_64(as,uVar4 & 0x7fffffffc0000000);
            if (!_Var1) {
              memory_mapping_list_add_merge_sorted_x86_64
                        (list,uVar4 & 0x7fffffffc0000000,virt_addr,0x40000000);
            }
          }
          else {
            walk_pde(list,as,uVar4 & uVar2 & 0xffffffffff000,a20_mask,virt_addr);
          }
        }
        lVar6 = lVar6 + 8;
        uVar7 = uVar7 + 0x40000000;
      } while (lVar6 != 0x1000);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x200);
  return;
}

Assistant:

static void walk_pml4e(MemoryMappingList *list, AddressSpace *as,
                       hwaddr pml4e_start_addr, int32_t a20_mask,
                       target_ulong start_line_addr)
{
    hwaddr pml4e_addr, pdpe_start_addr;
    uint64_t pml4e;
    target_ulong line_addr;
    int i;

    for (i = 0; i < 512; i++) {
        pml4e_addr = (pml4e_start_addr + i * 8) & a20_mask;
#ifdef UNICORN_ARCH_POSTFIX
        pml4e = glue(address_space_ldq, UNICORN_ARCH_POSTFIX)(as->uc, as, pml4e_addr, MEMTXATTRS_UNSPECIFIED,
#else
        pml4e = address_space_ldq(as->uc, as, pml4e_addr, MEMTXATTRS_UNSPECIFIED,
#endif
                                  NULL);
        if (!(pml4e & PG_PRESENT_MASK)) {
            /* not present */
            continue;
        }

        line_addr = start_line_addr | ((i & 0x1ffULL) << 39);
        pdpe_start_addr = (pml4e & PLM4_ADDR_MASK) & a20_mask;
        walk_pdpe(list, as, pdpe_start_addr, a20_mask, line_addr);
    }
}